

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O3

void sigmund_getrawpeaks(int npts,t_float *insamps,int npeak,t_peak_conflict *peakv,int *nfound,
                        t_float *power,t_float srate,int loud,t_float hifreq)

{
  t_sample *ptVar1;
  t_sample *ptVar2;
  t_peak_conflict *ptVar3;
  float fVar4;
  t_sample tVar5;
  t_sample tVar6;
  long lVar7;
  t_float *ftimag;
  undefined8 uVar8;
  t_sample *ptVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  t_sample *ptVar13;
  t_sample *ptVar14;
  t_float *ftreal;
  long lVar15;
  ulong uVar16;
  t_sample *ptVar17;
  int npts_00;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  float fVar22;
  uint uVar23;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar26 [16];
  float fVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  double local_f8;
  t_sample *local_f0;
  int *local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  t_peak_conflict *local_90;
  t_float *local_88;
  float local_80;
  uint local_7c;
  t_float *local_78;
  ulong local_70;
  uint local_64;
  t_sample *local_60;
  undefined1 local_58 [16];
  uint local_3c;
  t_sample *local_38;
  
  ptVar14 = (t_sample *)local_128;
  local_d8._8_8_ = local_d8._0_8_;
  local_d8._0_8_ = power;
  local_108 = ZEXT416((uint)(1.0 / (float)npts));
  dVar28 = (double)(1.0 / (float)npts);
  local_c8._8_8_ = local_c8._0_8_;
  local_c8._0_8_ = dVar28;
  dVar28 = (double)srate * 0.5 * dVar28;
  uStack_a4 = (undefined4)((ulong)dVar28 >> 0x20);
  local_a8 = (float)dVar28;
  local_7c = npts * 0x18 + 0x20;
  local_e0 = (ulong)local_7c;
  local_38 = (t_sample *)CONCAT44(local_38._4_4_,npts * 2);
  local_e8 = nfound;
  local_90 = peakv;
  local_64 = npeak;
  if ((int)local_7c < 400000) {
    ptVar14 = (t_sample *)(local_128 + -((long)(int)local_7c + 0xfU & 0xfffffffffffffff0));
    local_60 = ptVar14;
    iVar10 = npts * 2;
  }
  else {
    local_58._0_4_ = hifreq;
    local_60 = (t_sample *)getbytes(local_e0);
    iVar10 = (int)local_38;
    hifreq = (t_float)local_58._0_4_;
  }
  local_3c = (int)(hifreq / local_a8);
  if ((int)(npts - 4U) < (int)(hifreq / local_a8)) {
    local_3c = npts - 4U;
  }
  local_b8 = (long)iVar10;
  ptVar1 = local_60 + local_b8;
  lVar12 = (long)npts;
  uVar16 = (ulong)(uint)npts;
  local_58._0_8_ = lVar12;
  lVar20 = lVar12;
  local_70 = (ulong)(uint)npts;
  if (0 < npts) {
    uVar18 = 0;
    ptVar14[-2] = 2.495125e-39;
    ptVar14[-1] = 0.0;
    memset(ptVar1,0,uVar16 * 4);
    do {
      local_60[uVar18] = insamps[uVar18];
      uVar18 = uVar18 + 1;
      lVar20 = local_58._0_8_;
      iVar10 = (int)local_38;
    } while (uVar16 != uVar18);
  }
  ptVar17 = ptVar1 + lVar12 + lVar20;
  npts_00 = (int)local_70;
  if (npts_00 < iVar10) {
    ptVar2 = local_60 + local_58._0_8_;
    ptVar14[-2] = 2.495229e-39;
    ptVar14[-1] = 0.0;
    memset(ptVar2,0,(ulong)(npts_00 - 1) * 4 + 4);
    lVar20 = local_58._0_8_;
    iVar10 = (int)local_38;
  }
  ptVar2 = local_60;
  local_78 = ptVar1 + lVar12 + lVar20 + 4;
  local_38 = ptVar17;
  ptVar14[-2] = 2.49529e-39;
  ptVar14[-1] = 0.0;
  mayer_realfft(iVar10,ptVar2);
  uVar11 = local_3c;
  ptVar2 = local_60;
  ftreal = local_78;
  lVar7 = local_b8;
  if (0 < npts_00) {
    uVar18 = 0;
    do {
      local_78[uVar18] = local_60[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar16 != uVar18);
    uVar8 = local_58._0_8_;
    lVar15 = local_58._0_8_;
    if (npts_00 < 3) goto LAB_001b2c63;
    ptVar13 = local_60 + local_b8;
    lVar15 = 0;
    do {
      ptVar13 = ptVar13 + -1;
      ptVar1[uVar8 * 3 + lVar15 + 9] = *ptVar13;
      lVar15 = lVar15 + 1;
    } while ((ulong)(npts_00 - 1) - 1 != lVar15);
  }
  lVar15 = local_58._0_8_;
LAB_001b2c63:
  ptVar9 = local_38;
  uVar16 = (ulong)uVar11;
  tVar5 = local_38[5];
  tVar6 = local_38[6];
  ptVar13 = local_38 + 7;
  *local_38 = local_38[8];
  ptVar9[1] = *ptVar13;
  ptVar9[2] = tVar6;
  ptVar9[3] = tVar5;
  ptVar17[lVar20 + (long)(npts_00 + -1) + 8] = 0.0;
  ptVar17[lVar20 + 8] = 0.0;
  ptVar17[lVar20 + 4] = -ptVar17[lVar20 + 0xc];
  ptVar17[lVar20 + 5] = -ptVar17[lVar20 + 0xb];
  ptVar17[lVar20 + 6] = -ptVar17[lVar20 + 10];
  ptVar17[lVar20 + 7] = -ptVar17[lVar20 + 9];
  if ((int)uVar11 < 1) {
    fVar31 = 0.0;
  }
  else {
    fVar31 = 0.0;
    uVar18 = 0;
    do {
      fVar22 = (ptVar2[lVar15 * 2 + lVar7 + uVar18 + 5] - ptVar2[lVar15 * 2 + lVar7 + uVar18 + 3]) *
               (ptVar2[lVar15 * 2 + lVar7 + uVar18 + 5] - ptVar2[lVar15 * 2 + lVar7 + uVar18 + 3]) +
               (ptVar2[lVar15 * 3 + lVar7 + uVar18 + 9] - ptVar2[lVar15 * 3 + lVar7 + uVar18 + 7]) *
               (ptVar2[lVar15 * 3 + lVar7 + uVar18 + 9] - ptVar2[lVar15 * 3 + lVar7 + uVar18 + 7]);
      ptVar1[lVar12 + uVar18] = fVar22;
      if (1 < uVar18) {
        fVar31 = fVar31 + fVar22;
      }
      uVar18 = uVar18 + 1;
    } while (uVar16 != uVar18);
  }
  local_88 = ptVar9 + lVar15 + 8;
  (ptVar1 + lVar12 + (int)uVar11)[0] = 0.0;
  (ptVar1 + lVar12 + (int)uVar11)[1] = 0.0;
  *(float *)local_d8._0_8_ =
       (float)((double)fVar31 * 0.5 * (double)local_c8._0_8_ * (double)local_c8._0_8_);
  ptVar17 = (t_sample *)0x0;
  if (0 < (int)local_64) {
    local_f0 = (t_sample *)(ulong)local_64;
    local_38 = (t_sample *)0x0;
    local_80 = fVar31;
    local_f8 = (double)fVar31 * 1e-10;
    uVar18 = uVar16;
    do {
      uVar21 = 0xffffffff;
      fVar31 = 0.0;
      uVar23 = 0;
      uVar24 = 0;
      uVar25 = 0;
      uVar11 = (uint)uVar18;
      if (2 < (int)uVar11) {
        uVar19 = 0xffffffff;
        uVar18 = 2;
        do {
          fVar22 = ptVar1[lVar12 + uVar18];
          if ((fVar31 < fVar22) &&
             (ptVar2[lVar7 + uVar18] <= fVar22 && fVar22 != ptVar2[lVar7 + uVar18])) {
            dVar28 = (double)(ptVar1[lVar12 + (uVar18 - 2)] + ptVar1[lVar12 + uVar18 + 2]) * 0.6;
            fVar27 = (float)dVar28;
            uVar21 = -(uint)(fVar27 < fVar22);
            auVar29._0_4_ = ~uVar21 & (uint)fVar31;
            auVar29._4_4_ = ~(uint)((ulong)dVar28 >> 0x20) & uVar23;
            auVar29._8_4_ = uVar24;
            auVar29._12_4_ = uVar25;
            auVar29 = auVar29 | ZEXT416((uint)fVar22 & uVar21);
            if (fVar27 < fVar22) {
              uVar19 = uVar18 & 0xffffffff;
            }
            fVar31 = auVar29._0_4_;
            uVar23 = auVar29._4_4_;
            uVar24 = auVar29._8_4_;
            uVar25 = auVar29._12_4_;
          }
          uVar21 = (uint)uVar19;
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
      }
      if (((local_80 <= 0.0) || ((double)fVar31 < local_f8)) || ((int)uVar21 < 0)) {
        npts_00 = (int)local_70;
        ptVar17 = local_38;
        goto LAB_001b30d1;
      }
      iVar10 = uVar21 - 0x32;
      if (uVar21 < 0x35) {
        iVar10 = 2;
      }
      uVar23 = uVar21 + 0x32;
      if ((int)(uVar21 + 0x32) <= (int)uVar11) {
        uVar23 = uVar11;
      }
      if (iVar10 < (int)uVar23) {
        uVar18 = 0x34;
        if (0x34 < uVar21) {
          uVar18 = (ulong)uVar21;
        }
        uVar19 = uVar18 - 0x32;
        uVar11 = ((int)uVar18 - uVar21) - 0x32;
        do {
          fVar27 = (float)(int)uVar11;
          uVar11 = uVar11 + 1;
          fVar22 = fVar31 + fVar31;
          if (2 < uVar11) {
            fVar22 = (float)((double)fVar31 / ((double)(fVar27 * fVar27 * fVar27 * fVar27) + 1.0));
          }
          if (ptVar1[uVar19] <= fVar22 && fVar22 != ptVar1[uVar19]) {
            ptVar1[uVar19] = fVar22;
          }
          uVar19 = uVar19 + 1;
        } while (uVar23 != uVar19);
      }
      fVar31 = ftreal[(ulong)uVar21 - 1];
      fVar22 = ftreal[(ulong)uVar21 + 1];
      fVar33 = fVar22 - fVar31;
      fVar27 = local_88[(ulong)uVar21 - 1];
      fVar4 = local_88[(ulong)uVar21 + 1];
      fVar32 = fVar4 - fVar27;
      local_c8 = ZEXT416((uint)fVar32);
      local_d8 = ZEXT416((uint)fVar33);
      fVar32 = fVar33 * fVar33 + fVar32 * fVar32;
      fVar27 = fVar4 * fVar4 - fVar27 * fVar27;
      local_128 = ZEXT416((uint)fVar32);
      fVar22 = (fVar27 + (fVar22 * fVar22 - fVar31 * fVar31)) / (fVar32 + fVar32);
      fVar31 = 0.5;
      fStack_b0 = 0.0;
      if ((fVar22 <= 0.5) && (fVar31 = fVar22, fStack_b0 = fVar27, fVar22 < -0.5)) {
        fVar31 = -0.5;
        fStack_b0 = 0.0;
      }
      local_b8 = CONCAT44(fStack_b0,fVar31);
      local_58._8_4_ = fStack_b0;
      local_58._0_8_ = (double)(fVar31 * 3.1415927);
      local_58._12_4_ = fStack_b0;
      fStack_ac = fStack_b0;
      ptVar14[-2] = 2.496553e-39;
      ptVar14[-1] = 0.0;
      dVar28 = sin((double)(fVar31 * 3.1415927));
      local_118._8_4_ = extraout_XMM0_Dc;
      local_118._0_8_ = dVar28;
      local_118._12_4_ = extraout_XMM0_Dd;
      uVar8 = local_58._0_8_;
      ptVar14[-2] = 2.496577e-39;
      ptVar14[-1] = 0.0;
      dVar28 = cos((double)uVar8);
      fVar31 = (float)dVar28;
      auVar30._0_4_ = (float)((double)local_58._0_8_ + 1.5707963267948966);
      auVar30._4_4_ = (float)((double)local_58._0_8_ + -1.5707963267948966);
      auVar30._8_8_ = 0;
      auVar26._0_8_ = CONCAT44(fVar31,fVar31) ^ 0x8000000000000000;
      auVar26._8_8_ = 0;
      auVar29 = divps(auVar26,auVar30);
      fVar22 = 1.0 / ((float)(-(uint)(ABS(auVar30._4_4_) < 0.003) & 0x3f800000 |
                             ~-(uint)(ABS(auVar30._4_4_) < 0.003) & auVar29._4_4_) +
                     (float)(-(uint)(ABS(auVar30._0_4_) < 0.003) & 0x3f800000 |
                            ~-(uint)(ABS(auVar30._0_4_) < 0.003) & auVar29._0_4_));
      ptVar3 = local_90 + (long)local_38;
      ptVar3->p_freq = local_a8 * ((float)local_b8 + (float)local_b8 + (float)(int)uVar21);
      ptVar3->p_amp = fVar22 * SQRT((float)local_128._0_4_) * (float)local_108._0_4_;
      ptVar3->p_ampreal =
           fVar22 * ((float)local_d8._0_4_ * fVar31 +
                    (float)(double)local_118._0_8_ * -(float)local_c8._0_4_) *
           (float)local_108._0_4_;
      ptVar3->p_ampimag =
           fVar22 * ((float)local_d8._0_4_ * (float)(double)local_118._0_8_ +
                    fVar31 * (float)local_c8._0_4_) * (float)local_108._0_4_;
      local_38 = (t_sample *)((long)local_38 + 1);
      uVar18 = (ulong)local_3c;
      ftreal = local_78;
    } while (local_38 != local_f0);
    npts_00 = (int)local_70;
    ptVar17 = (t_sample *)(ulong)local_64;
    uVar11 = local_3c;
  }
LAB_001b30d1:
  ftimag = local_88;
  ptVar3 = local_90;
  fVar31 = local_a8;
  iVar10 = (int)ptVar17;
  ptVar14[-2] = 2.497124e-39;
  ptVar14[-1] = 0.0;
  sigmund_tweak(npts_00,ftreal,ftimag,iVar10,ptVar3,fVar31,uVar11);
  fVar31 = local_a8;
  ptVar14[-2] = 2.497162e-39;
  ptVar14[-1] = 0.0;
  sigmund_tweak(npts_00,ftreal,ftimag,iVar10,ptVar3,fVar31,uVar11);
  if (iVar10 != 0) {
    lVar20 = 0;
    do {
      fVar31 = *(float *)((long)&ptVar3->p_freq + lVar20);
      fVar22 = -1500.0;
      if (0.0 < fVar31) {
        ptVar14[-2] = 2.497248e-39;
        ptVar14[-1] = 0.0;
        dVar28 = log((double)fVar31 * 0.12231220585);
        fVar22 = (float)(dVar28 * 17.3123405046);
      }
      *(float *)((long)&ptVar3->p_pit + lVar20) = fVar22;
      fVar31 = *(float *)((long)&ptVar3->p_amp + lVar20);
      fVar22 = 0.0;
      if (0.0 < fVar31) {
        ptVar14[-2] = 2.497313e-39;
        ptVar14[-1] = 0.0;
        dVar28 = log((double)fVar31);
        fVar31 = (float)(dVar28 * 4.3429448190326045 + 100.0);
        fVar22 = 0.0;
        if (0.0 <= fVar31) {
          fVar22 = fVar31;
        }
      }
      *(float *)((long)&ptVar3->p_db + lVar20) = fVar22;
      lVar20 = lVar20 + 0x20;
    } while (((ulong)ptVar17 & 0xffffffff) << 5 != lVar20);
  }
  ptVar1 = local_60;
  uVar16 = local_e0;
  *local_e8 = iVar10;
  if (399999 < (int)local_7c) {
    ptVar14[-2] = 2.497432e-39;
    ptVar14[-1] = 0.0;
    freebytes(ptVar1,uVar16);
  }
  return;
}

Assistant:

static void sigmund_getrawpeaks(int npts, t_float *insamps,
    int npeak, t_peak *peakv, int *nfound, t_float *power, t_float srate,
    int loud, t_float hifreq)
{
    t_float oneovern = 1.0/ (t_float)npts;
    t_float fperbin = 0.5 * srate * oneovern, totalpower = 0;
    int npts2 = 2*npts, i, bin, bufsize = sizeof (t_float ) *
        (2*NEGBINS + 6*npts);
    int peakcount = 0;
    t_float *fp1, *fp2;
    t_float *rawreal, *rawimag, *maskbuf, *powbuf;
    t_float *bigbuf = (t_float *)BUF_ALLOCA(bufsize);
    int maxbin = hifreq/fperbin;
    if (maxbin > npts - NEGBINS)
        maxbin = npts - NEGBINS;
    /* if (loud) post("tweak %d", tweak); */
    maskbuf = bigbuf + npts2;
    powbuf = maskbuf + npts;
    rawreal = powbuf + npts+NEGBINS;
    rawimag = rawreal+npts+NEGBINS;
    for (i = 0; i < npts; i++)
        maskbuf[i] = 0;

    for (i = 0; i < npts; i++)
        bigbuf[i] = insamps[i];
    for (i = npts; i < 2*npts; i++)
        bigbuf[i] = 0;
    mayer_realfft(npts2, bigbuf);
    for (i = 0; i < npts; i++)
        rawreal[i] = bigbuf[i];
    for (i = 1; i < npts-1; i++)
        rawimag[i] = bigbuf[npts2-i];
    rawreal[-1] = rawreal[1];
    rawreal[-2] = rawreal[2];
    rawreal[-3] = rawreal[3];
    rawreal[-4] = rawreal[4];
    rawimag[0] = rawimag[npts-1] = 0;
    rawimag[-1] = -rawimag[1];
    rawimag[-2] = -rawimag[2];
    rawimag[-3] = -rawimag[3];
    rawimag[-4] = -rawimag[4];
#if 1
    for (i = 0, fp1 = rawreal, fp2 = rawimag; i < maxbin; i++, fp1++, fp2++)
    {
        t_float x1 = fp1[1] - fp1[-1], x2 = fp2[1] - fp2[-1],
            p = powbuf[i] = x1*x1+x2*x2;
        if (i >= 2)
           totalpower += p;
    }
    powbuf[maxbin] = powbuf[maxbin+1] = 0;
    *power = 0.5 * totalpower *oneovern * oneovern;
#endif
    for (peakcount = 0; peakcount < npeak; peakcount++)
    {
        t_float pow1, maxpower = 0, windreal, windimag, windpower,
            detune, pidetune, sinpidetune, cospidetune, ampcorrect, ampout,
            ampoutreal, ampoutimag, freqout, powmask;
        int bestindex = -1;

        for (bin = 2, fp1 = rawreal+2, fp2 = rawimag+2;
            bin < maxbin; bin++, fp1++, fp2++)
        {
            pow1 = powbuf[bin];
            if (pow1 > maxpower && pow1 > maskbuf[bin])
            {
                t_float thresh = PEAKTHRESHFACTOR *
                    (powbuf[bin-2]+powbuf[bin+2]);
                if (pow1 > thresh)
                    maxpower = pow1, bestindex = bin;
            }
        }

        if (totalpower <= 0 || maxpower < 1e-10*totalpower || bestindex < 0)
            break;
        fp1 = rawreal+bestindex;
        fp2 = rawimag+bestindex;
        powmask = maxpower * PEAKMASKFACTOR;
        /* if (loud > 2)
            post("maxpower %f, powmask %f, param1 %f",
                maxpower, powmask, param1); */
        sigmund_remask(maxbin, bestindex, powmask, maxpower, maskbuf);
        
        /* if (loud > 1)
            post("best index %d, total power %f", bestindex, totalpower); */

        windreal = fp1[1] - fp1[-1];
        windimag = fp2[1] - fp2[-1];
        windpower = windreal * windreal + windimag * windimag;
        detune = ((fp1[1] * fp1[1] - fp1[-1]*fp1[-1]) 
            + (fp2[1] * fp2[1] - fp2[-1]*fp2[-1])) / (2 * windpower);

        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 1)
            post("windpower %f, index %d, detune %f",
                windpower, bestindex, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);
        ampcorrect = 1.0 / window_mag(pidetune, cospidetune);

        ampout = ampcorrect *sqrt(windpower);
        ampoutreal = ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);

            /* the frequency is the sum of the bin frequency and detuning */

        peakv[peakcount].p_freq = (freqout = (bestindex + 2*detune)) * fperbin;
        peakv[peakcount].p_amp = oneovern * ampout;
        peakv[peakcount].p_ampreal = oneovern * ampoutreal;
        peakv[peakcount].p_ampimag = oneovern * ampoutimag;
    }
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    for (i = 0; i < peakcount; i++)
    {
        peakv[i].p_pit = sigmund_ftom(peakv[i].p_freq);
        peakv[i].p_db = sigmund_powtodb(peakv[i].p_amp);
    }
    *nfound = peakcount;
    BUF_FREEA(bigbuf, bufsize);
}